

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3b55d::SwizzleTestBase<3U,_32849U>::~SwizzleTestBase
          (SwizzleTestBase<3U,_32849U> *this)

{
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SwizzleTestBase_001854d8;
  WriterTestHelper<unsigned_char,_3U,_32849U>::~WriterTestHelper(&this->helper);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

SwizzleTestBase() {
        std::vector<GLubyte> color;
        // Use swizzle enumerator values for easy checking of result.
        std::vector<GLubyte> defaultColor = { R, G, B, A };
        color.resize(num_components);
        for (uint32_t i = 0; i < num_components; i++) {
            color[i] = defaultColor[i];
        }
        helper.resize(createFlagBits::eNone, 1, 1, 2, width, height, 1, &color);
    }